

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O3

void check_equal<booster::sub_match<char_const*>,char_const*>(sub_match<const_char_*> *a,char *b)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  iVar1 = booster::sub_match<const_char_*>::compare(a,b);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," a==b",5);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(a,b);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," b==a",5);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(a,b);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x41);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," !(a!=b)",8);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = booster::sub_match<const_char_*>::compare(a,b);
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
             ,0x6e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x42);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," !(b!=a)",8);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,local_1b0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_equal(Match const &a,Other b)
{
	TEST(a==b);
	TEST(b==a);
	TEST(!(a!=b));
	TEST(!(b!=a));
}